

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

QRect __thiscall QPicture::boundingRect(QPicture *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  QPicturePrivate *this_00;
  undefined4 uVar6;
  undefined4 in_EAX;
  int iVar7;
  QRect *pQVar8;
  long lVar9;
  undefined1 auVar10 [16];
  QRect QVar11;
  
  this_00 = (this->d_ptr).d.ptr;
  uVar1 = (this_00->override_rect).x1;
  uVar3 = (this_00->override_rect).y1;
  uVar2 = (this_00->override_rect).x2;
  uVar4 = (this_00->override_rect).y2;
  auVar10._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
  auVar10._4_4_ = auVar10._0_4_;
  auVar10._8_4_ = -(uint)((int)uVar4 < (int)uVar3);
  auVar10._12_4_ = -(uint)((int)uVar4 < (int)uVar3);
  iVar7 = movmskpd(in_EAX,auVar10);
  if (iVar7 == 0) {
    pQVar8 = &this_00->override_rect;
    lVar9 = 0x40;
  }
  else {
    if (this_00->formatOk == false) {
      QPicturePrivate::checkFormat(this_00);
    }
    pQVar8 = &this_00->brect;
    lVar9 = 0x30;
  }
  uVar5 = pQVar8->x1;
  uVar6 = pQVar8->y1;
  QVar11.y1.m_i = uVar6;
  QVar11.x1.m_i = uVar5;
  QVar11._8_8_ = *(undefined8 *)
                  ((long)&(this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int>._M_i + lVar9);
  return QVar11;
}

Assistant:

constexpr P get() const noexcept { return ptr; }